

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_set_format.c
# Opt level: O1

int archive_read_set_format(archive *_a,int code)

{
  ulong uVar1;
  uint3 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  size_t *psVar6;
  char str [10];
  undefined8 local_38;
  
  iVar3 = archive_read_support_format_by_code(_a,code);
  if (-1 < iVar3) {
    iVar3 = -0x14;
    if (_a[0x15].archive_format_name == (char *)0x0) {
      iVar3 = 0;
    }
    uVar2 = local_38._5_3_;
    switch((code & 0xff0000U) - 0x10000 >> 0x10) {
    case 0:
      local_38 = (ulong)uVar2 << 0x28;
      local_38 = CONCAT44(local_38._4_4_,0x6f697063);
      break;
    default:
      archive_set_error(_a,0x16,"Invalid format code specified");
      return -0x1e;
    case 2:
      local_38 = CONCAT44(local_38._4_4_,0x726174);
      break;
    case 3:
      local_38 = 0x303636396f7369;
      break;
    case 4:
      local_38 = CONCAT44(local_38._4_4_,0x70697a);
      break;
    case 6:
      uVar1 = (ulong)local_38 >> 0x10;
      local_38 = CONCAT62((uint6)uVar1 & 0xffffffffff00,0x7261);
      break;
    case 7:
      local_38 = CONCAT26(local_38._6_2_,0x6500000000);
      local_38 = CONCAT44(local_38._4_4_,0x6572746d);
      break;
    case 9:
      local_38 = CONCAT44(local_38._4_4_,0x726178);
      break;
    case 10:
      local_38 = CONCAT44(local_38._4_4_,0x61686c);
      break;
    case 0xb:
      local_38 = CONCAT44(local_38._4_4_,0x626163);
      break;
    case 0xc:
      local_38 = CONCAT44(local_38._4_4_,0x726172);
      break;
    case 0xd:
      local_38 = (ulong)uVar2 << 0x28;
      local_38 = CONCAT44(local_38._4_4_,0x70697a37);
    }
    psVar6 = &_a[8].error_string.length;
    _a[0x15].archive_format_name = (char *)psVar6;
    iVar5 = 0x10;
    do {
      if (((char *)psVar6[1] == (char *)0x0) ||
         (iVar4 = strcmp((char *)psVar6[1],(char *)&local_38), iVar4 == 0)) break;
      psVar6 = psVar6 + 0xb;
      _a[0x15].archive_format_name = (char *)psVar6;
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
    if (((char *)psVar6[1] == (char *)0x0) ||
       (iVar5 = strcmp((char *)psVar6[1],(char *)&local_38), iVar5 != 0)) {
      archive_set_error(_a,0x16,"Internal error: Unable to set format");
      iVar5 = -0x1e;
    }
    else {
      iVar5 = 0;
    }
    if (iVar5 < iVar3) {
      iVar3 = iVar5;
    }
  }
  return iVar3;
}

Assistant:

int
archive_read_set_format(struct archive *_a, int code)
{
  int r1, r2, slots, i;
  char str[10];
  struct archive_read *a = (struct archive_read *)_a;

  if ((r1 = archive_read_support_format_by_code(_a, code)) < (ARCHIVE_OK))
    return r1;

  r1 = r2 = (ARCHIVE_OK);
  if (a->format)
    r2 = (ARCHIVE_WARN);
  switch (code & ARCHIVE_FORMAT_BASE_MASK)
  {
    case ARCHIVE_FORMAT_7ZIP:
      strcpy(str, "7zip");
      break;
    case ARCHIVE_FORMAT_AR:
      strcpy(str, "ar");
      break;
    case ARCHIVE_FORMAT_CAB:
      strcpy(str, "cab");
      break;
    case ARCHIVE_FORMAT_CPIO:
      strcpy(str, "cpio");
      break;
    case ARCHIVE_FORMAT_ISO9660:
      strcpy(str, "iso9660");
      break;
    case ARCHIVE_FORMAT_LHA:
      strcpy(str, "lha");
      break;
    case ARCHIVE_FORMAT_MTREE:
      strcpy(str, "mtree");
      break;
    case ARCHIVE_FORMAT_RAR:
      strcpy(str, "rar");
      break;
    case ARCHIVE_FORMAT_TAR:
      strcpy(str, "tar");
      break;
    case ARCHIVE_FORMAT_XAR:
      strcpy(str, "xar");
      break;
    case ARCHIVE_FORMAT_ZIP:
      strcpy(str, "zip");
      break;
    default:
      archive_set_error(&a->archive, ARCHIVE_ERRNO_PROGRAMMER,
          "Invalid format code specified");
      return (ARCHIVE_FATAL);
  }

  slots = sizeof(a->formats) / sizeof(a->formats[0]);
  a->format = &(a->formats[0]);
  for (i = 0; i < slots; i++, a->format++) {
    if (!a->format->name || !strcmp(a->format->name, str))
      break;
  }
  if (!a->format->name || strcmp(a->format->name, str))
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_PROGRAMMER,
        "Internal error: Unable to set format");
    r1 = (ARCHIVE_FATAL);
  }

  return (r1 < r2) ? r1 : r2;
}